

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_test_utils.h
# Opt level: O0

double lf::assemble::test::multVecAssMat<double,lf::assemble::test::MVMultAssembler>
                 (dim_t codim,DofHandler *dofh,MVMultAssembler *entity_matrix_provider,
                 Matrix<double,__1,_1,_0,__1,_1> *vec)

{
  Scalar SVar1;
  Entity *cell;
  EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this;
  bool bVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ostream *poVar6;
  Index IVar7;
  element_type *peVar8;
  undefined4 extraout_var;
  reference ppEVar9;
  elem_mat_t *other;
  Index IVar10;
  reference peVar11;
  Scalar *pSVar12;
  ReturnType RVar13;
  undefined1 auVar14 [16];
  Product<Eigen::Matrix<double,__1,__1,_1,_4,_4>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> PVar15;
  Product<Eigen::Matrix<double,__1,__1,_1,_4,_4>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_8a0;
  uint local_88c;
  undefined1 local_888 [4];
  int l;
  Matrix<double,__1,_1,_0,__1,_1> locvec;
  string local_870;
  allocator<char> local_849;
  string local_848;
  allocator<char> local_821;
  string local_820;
  string local_800;
  allocator<char> local_7d9;
  string local_7d8;
  allocator<char> local_7b1;
  string local_7b0;
  stringstream local_790 [8];
  stringstream ss_2;
  ostream local_780 [383];
  allocator<char> local_601;
  string local_600;
  allocator<char> local_5d9;
  string local_5d8;
  allocator<char> local_5b1;
  string local_5b0;
  string local_590;
  allocator<char> local_569;
  string local_568;
  allocator<char> local_541;
  string local_540;
  stringstream local_520 [8];
  stringstream ss_1;
  ostream local_510 [376];
  undefined1 local_398 [8];
  elem_mat_t elem_mat;
  span<const_long,_18446744073709551615UL> global_idx;
  size_type elmat_dim;
  Entity *entity;
  iterator __end3;
  iterator __begin3;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range3;
  double s;
  shared_ptr<const_lf::mesh::Mesh> mesh;
  string local_2a0;
  allocator<char> local_279;
  string local_278;
  allocator<char> local_251;
  string local_250;
  string local_230;
  allocator<char> local_209;
  string local_208;
  allocator<char> local_1e1;
  string local_1e0;
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [376];
  EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *local_28;
  Matrix<double,__1,_1,_0,__1,_1> *vec_local;
  MVMultAssembler *entity_matrix_provider_local;
  DofHandler *dofh_local;
  dim_t codim_local;
  
  local_28 = (EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)vec;
  vec_local = (Matrix<double,__1,_1,_0,__1,_1> *)entity_matrix_provider;
  entity_matrix_provider_local = (MVMultAssembler *)dofh;
  dofh_local._4_4_ = codim;
  uVar3 = (*dofh->_vptr_DofHandler[2])();
  uVar5 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size(local_28);
  if (uVar3 != uVar5) {
    std::__cxx11::stringstream::stringstream(local_1b0);
    poVar6 = std::operator<<(local_1a0,"NoDof mismatch ");
    uVar3 = (*(code *)entity_matrix_provider_local->mesh_[2]._vptr_Mesh)();
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar3);
    poVar6 = std::operator<<(poVar6," <-> ");
    IVar7 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size(local_28);
    std::ostream::operator<<(poVar6,IVar7);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e0,"dofh.NumDofs() == vec.size()",&local_1e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/test/assembly_test_utils.h"
               ,&local_209);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1e0,&local_208,0x19b,&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_208);
    std::allocator<char>::~allocator(&local_209);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::allocator<char>::~allocator(&local_1e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"false",&local_251);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/test/assembly_test_utils.h"
               ,&local_279);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a0,"",
               (allocator<char> *)
               ((long)&mesh.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 7));
    lf::base::AssertionFailed(&local_250,&local_278,0x19b,&local_2a0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&mesh.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 7));
    std::__cxx11::string::~string((string *)&local_278);
    std::allocator<char>::~allocator(&local_279);
    std::__cxx11::string::~string((string *)&local_250);
    std::allocator<char>::~allocator(&local_251);
    abort();
  }
  (*(code *)entity_matrix_provider_local->mesh_[8]._vptr_Mesh)();
  __range3 = (span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)0x0;
  peVar8 = std::__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&s);
  iVar4 = (*peVar8->_vptr_Mesh[2])(peVar8,(ulong)dofh_local._4_4_);
  __begin3._M_current = (Entity **)CONCAT44(extraout_var,iVar4);
  __end3 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                     ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin3);
  entity = (Entity *)
           std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                     ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin3);
  do {
    bVar2 = __gnu_cxx::
            operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                      (&__end3,(__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                                *)&entity);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      std::shared_ptr<const_lf::mesh::Mesh>::~shared_ptr((shared_ptr<const_lf::mesh::Mesh> *)&s);
      return (double)__range3;
    }
    ppEVar9 = __gnu_cxx::
              __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
              ::operator*(&__end3);
    cell = *ppEVar9;
    bVar2 = MVMultAssembler::isActive((MVMultAssembler *)vec_local,cell);
    if (bVar2) {
      global_idx._M_extent._M_extent_value._4_4_ =
           (*(code *)entity_matrix_provider_local->mesh_[3]._vptr_Mesh)
                     (entity_matrix_provider_local,cell);
      auVar14 = (*(code *)entity_matrix_provider_local->mesh_[5]._vptr_Mesh)
                          (entity_matrix_provider_local,cell);
      global_idx._M_ptr = auVar14._8_8_;
      elem_mat.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,_4,_4>_>.m_storage.m_cols =
           auVar14._0_8_;
      other = MVMultAssembler::Eval((MVMultAssembler *)vec_local,cell);
      Eigen::Matrix<double,_-1,_-1,_1,_4,_4>::Matrix
                ((Matrix<double,__1,__1,_1,_4,_4> *)local_398,other);
      uVar5 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_4,_4>_>::rows
                        ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,_4,_4>_> *)local_398);
      if (uVar5 != global_idx._M_extent._M_extent_value._4_4_) {
        std::__cxx11::stringstream::stringstream(local_520);
        poVar6 = std::operator<<(local_510,"nrows mismatch ");
        IVar10 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_4,_4>_>::rows
                           ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,_4,_4>_> *)local_398);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,IVar10);
        poVar6 = std::operator<<(poVar6," <-> ");
        poVar6 = (ostream *)
                 std::ostream::operator<<(poVar6,global_idx._M_extent._M_extent_value._4_4_);
        poVar6 = std::operator<<(poVar6,", entity ");
        peVar8 = std::
                 __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&s);
        uVar3 = (*peVar8->_vptr_Mesh[5])(peVar8,cell);
        std::ostream::operator<<(poVar6,uVar3);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_540,"elem_mat.rows() == elmat_dim",&local_541);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_568,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/test/assembly_test_utils.h"
                   ,&local_569);
        std::__cxx11::stringstream::str();
        lf::base::AssertionFailed(&local_540,&local_568,0x1ad,&local_590);
        std::__cxx11::string::~string((string *)&local_590);
        std::__cxx11::string::~string((string *)&local_568);
        std::allocator<char>::~allocator(&local_569);
        std::__cxx11::string::~string((string *)&local_540);
        std::allocator<char>::~allocator(&local_541);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_5b0,"false",&local_5b1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_5d8,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/test/assembly_test_utils.h"
                   ,&local_5d9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_600,"",&local_601);
        lf::base::AssertionFailed(&local_5b0,&local_5d8,0x1ad,&local_600);
        std::__cxx11::string::~string((string *)&local_600);
        std::allocator<char>::~allocator(&local_601);
        std::__cxx11::string::~string((string *)&local_5d8);
        std::allocator<char>::~allocator(&local_5d9);
        std::__cxx11::string::~string((string *)&local_5b0);
        std::allocator<char>::~allocator(&local_5b1);
        abort();
      }
      uVar5 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_4,_4>_>::cols
                        ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,_4,_4>_> *)local_398);
      if (uVar5 != global_idx._M_extent._M_extent_value._4_4_) {
        std::__cxx11::stringstream::stringstream(local_790);
        poVar6 = std::operator<<(local_780,"ncols mismatch ");
        IVar10 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_4,_4>_>::cols
                           ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,_4,_4>_> *)local_398);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,IVar10);
        poVar6 = std::operator<<(poVar6," <-> ");
        poVar6 = (ostream *)
                 std::ostream::operator<<(poVar6,global_idx._M_extent._M_extent_value._4_4_);
        poVar6 = std::operator<<(poVar6,", entity ");
        peVar8 = std::
                 __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&s);
        uVar3 = (*peVar8->_vptr_Mesh[5])(peVar8,cell);
        std::ostream::operator<<(poVar6,uVar3);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_7b0,"elem_mat.cols() == elmat_dim",&local_7b1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_7d8,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/test/assembly_test_utils.h"
                   ,&local_7d9);
        std::__cxx11::stringstream::str();
        lf::base::AssertionFailed(&local_7b0,&local_7d8,0x1b0,&local_800);
        std::__cxx11::string::~string((string *)&local_800);
        std::__cxx11::string::~string((string *)&local_7d8);
        std::allocator<char>::~allocator(&local_7d9);
        std::__cxx11::string::~string((string *)&local_7b0);
        std::allocator<char>::~allocator(&local_7b1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_820,"false",&local_821);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_848,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/test/assembly_test_utils.h"
                   ,&local_849);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_870,"",
                   (allocator<char> *)
                   ((long)&locvec.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                           m_storage.m_rows + 7));
        lf::base::AssertionFailed(&local_820,&local_848,0x1b0,&local_870);
        std::__cxx11::string::~string((string *)&local_870);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&locvec.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                           m_storage.m_rows + 7));
        std::__cxx11::string::~string((string *)&local_848);
        std::allocator<char>::~allocator(&local_849);
        std::__cxx11::string::~string((string *)&local_820);
        std::allocator<char>::~allocator(&local_821);
        abort();
      }
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<unsigned_int>
                ((Matrix<double,__1,_1,_0,__1,_1> *)local_888,
                 (uint *)((long)&global_idx._M_extent._M_extent_value + 4));
      for (local_88c = 0; this = local_28, local_88c < global_idx._M_extent._M_extent_value._4_4_;
          local_88c = local_88c + 1) {
        peVar11 = std::span<const_long,_18446744073709551615UL>::operator[]
                            ((span<const_long,_18446744073709551615UL> *)
                             &elem_mat.
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,_4,_4>_>.
                              m_storage.m_cols,(long)(int)local_88c);
        pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,
                             *peVar11);
        SVar1 = *pSVar12;
        pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_888
                             ,(long)(int)local_88c);
        *pSVar12 = SVar1;
      }
      PVar15 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,1,4,4>>::operator*
                         ((MatrixBase<Eigen::Matrix<double,_1,_1,1,4,4>> *)local_398,
                          (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_888);
      local_8a0 = PVar15;
      RVar13 = Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
               dot<Eigen::Product<Eigen::Matrix<double,_1,_1,1,4,4>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
                         ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_888,
                          (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_1,_4,_4>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                           *)&local_8a0);
      __range3 = (span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)
                 (RVar13 + (double)__range3);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_888);
    }
    __gnu_cxx::
    __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
    ::operator++(&__end3);
  } while( true );
}

Assistant:

SCALAR multVecAssMat(lf::assemble::dim_t codim,
                     const lf::assemble::DofHandler &dofh,
                     ENTITY_MATRIX_PROVIDER &entity_matrix_provider,
                     Eigen::Matrix<SCALAR, Eigen::Dynamic, 1> &vec) {
  LF_ASSERT_MSG(dofh.NumDofs() == vec.size(),
                "NoDof mismatch " << dofh.NumDofs() << " <-> " << vec.size());
  // Pointer to underlying mesh
  auto mesh = dofh.Mesh();
  // Summation variable
  SCALAR s{};
  // Loop over entities of co-dimension codim
  for (const lf::mesh::Entity *const entity : mesh->Entities(codim)) {
    // Some entities may be skipped
    if (entity_matrix_provider.isActive(*entity)) {
      // Size, aka number of rows and columns, of element matrix
      const lf::assemble::size_type elmat_dim = dofh.NumLocalDofs(*entity);
      // Global indices of local shape functions
      std::span<const gdof_idx_t> global_idx(dofh.GlobalDofIndices(*entity));
      // Request local matrix from entity_matrix_provider object. In the case
      // codim = 0, when `entity` is a cell, this is the element matrix
      const auto elem_mat{entity_matrix_provider.Eval(*entity)};
      LF_ASSERT_MSG(elem_mat.rows() == elmat_dim,
                    "nrows mismatch " << elem_mat.rows() << " <-> " << elmat_dim
                                      << ", entity " << mesh->Index(*entity));
      LF_ASSERT_MSG(elem_mat.cols() == elmat_dim,
                    "ncols mismatch " << elem_mat.cols() << " <-> " << elmat_dim
                                      << ", entity " << mesh->Index(*entity));
      Eigen::Matrix<SCALAR, Eigen::Dynamic, 1> locvec(elmat_dim);
      for (int l = 0; l < elmat_dim; ++l) {
        locvec[l] = vec[global_idx[l]];
      }
      s += locvec.dot(elem_mat * locvec);
    }
  }
  return s;
}